

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O3

void vkt::pipeline::uploadTestTexture
               (DeviceInterface *vk,VkDevice device,VkQueue queue,deUint32 queueFamilyIndex,
               Allocator *allocator,TestTexture *srcTexture,VkImage destImage)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar3;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TextureFormat TVar4;
  undefined4 extraout_var_05;
  ulong uVar5;
  TestTexture *srcTexture_00;
  TestTexture *local_40 [2];
  
  iVar2 = (*srcTexture->_vptr_TestTexture[0xe])(srcTexture);
  bVar1 = tcu::isCombinedDepthStencilType(*(ChannelType *)(CONCAT44(extraout_var,iVar2) + 4));
  if (!bVar1) {
    iVar2 = (*srcTexture->_vptr_TestTexture[0xe])(srcTexture);
    uploadTestTextureInternal
              (vk,device,queue,queueFamilyIndex,allocator,srcTexture,(TestTexture *)0x0,
               *(TextureFormat *)CONCAT44(extraout_var_02,iVar2),destImage);
    return;
  }
  iVar2 = (*srcTexture->_vptr_TestTexture[0xe])(srcTexture);
  bVar1 = tcu::hasDepthComponent(*(ChannelOrder *)CONCAT44(extraout_var_00,iVar2));
  if (!bVar1) {
    srcTexture_00 = (TestTexture *)0x0;
    goto LAB_004c7b59;
  }
  iVar2 = (*srcTexture->_vptr_TestTexture[0xe])(srcTexture);
  iVar2 = *(int *)(CONCAT44(extraout_var_01,iVar2) + 4);
  if (iVar2 == 0x25) {
    uVar3 = 0x2300000000;
LAB_004c7b2b:
    uVar5 = 0x12;
  }
  else {
    if (iVar2 == 0x1a) {
      uVar3 = 0x1a00000000;
      goto LAB_004c7b2b;
    }
    if (iVar2 == 0x18) {
      uVar3 = 0x400000000;
      goto LAB_004c7b2b;
    }
    uVar3 = 0x2600000000;
    uVar5 = 0x15;
  }
  (*srcTexture->_vptr_TestTexture[0xd])(local_40,srcTexture,uVar5 | uVar3);
  srcTexture_00 = local_40[0];
LAB_004c7b59:
  iVar2 = (*srcTexture->_vptr_TestTexture[0xe])(srcTexture);
  bVar1 = tcu::hasStencilComponent(*(ChannelOrder *)CONCAT44(extraout_var_03,iVar2));
  if (bVar1) {
    iVar2 = (*srcTexture->_vptr_TestTexture[0xe])(srcTexture);
    TVar4 = tcu::getEffectiveDepthStencilTextureFormat
                      ((TextureFormat *)CONCAT44(extraout_var_04,iVar2),MODE_STENCIL);
    (*srcTexture->_vptr_TestTexture[0xd])(local_40,srcTexture,TVar4);
  }
  else {
    local_40[0] = (TestTexture *)0x0;
  }
  iVar2 = (*srcTexture->_vptr_TestTexture[0xe])(srcTexture);
  uploadTestTextureInternal
            (vk,device,queue,queueFamilyIndex,allocator,srcTexture_00,local_40[0],
             *(TextureFormat *)CONCAT44(extraout_var_05,iVar2),destImage);
  if (local_40[0] != (TestTexture *)0x0) {
    (*local_40[0]->_vptr_TestTexture[1])(local_40[0]);
  }
  (*srcTexture_00->_vptr_TestTexture[1])(srcTexture_00);
  return;
}

Assistant:

void uploadTestTexture (const DeviceInterface&			vk,
						VkDevice						device,
						VkQueue							queue,
						deUint32						queueFamilyIndex,
						Allocator&						allocator,
						const TestTexture&				srcTexture,
						VkImage							destImage)
{
	if (tcu::isCombinedDepthStencilType(srcTexture.getTextureFormat().type))
	{
		de::MovePtr<TestTexture> srcDepthTexture;
		de::MovePtr<TestTexture> srcStencilTexture;

		if (tcu::hasDepthComponent(srcTexture.getTextureFormat().order))
		{
			tcu::TextureFormat format;
			switch (srcTexture.getTextureFormat().type) {
			case tcu::TextureFormat::UNSIGNED_INT_16_8_8:
				format = tcu::TextureFormat(tcu::TextureFormat::D, tcu::TextureFormat::UNORM_INT16);
				break;
			case tcu::TextureFormat::UNSIGNED_INT_24_8_REV:
				format = tcu::TextureFormat(tcu::TextureFormat::D, tcu::TextureFormat::UNSIGNED_INT_24_8_REV);
				break;
			case tcu::TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:
				format = tcu::TextureFormat(tcu::TextureFormat::D, tcu::TextureFormat::FLOAT);
				break;
			default:
				DE_ASSERT(0);
				break;
			}
			srcDepthTexture = srcTexture.copy(format);
		}

		if (tcu::hasStencilComponent(srcTexture.getTextureFormat().order))
			srcStencilTexture = srcTexture.copy(tcu::getEffectiveDepthStencilTextureFormat(srcTexture.getTextureFormat(), tcu::Sampler::MODE_STENCIL));

		uploadTestTextureInternal(vk, device, queue, queueFamilyIndex, allocator, *srcDepthTexture, srcStencilTexture.get(), srcTexture.getTextureFormat(), destImage);
	}
	else
		uploadTestTextureInternal(vk, device, queue, queueFamilyIndex, allocator, srcTexture, DE_NULL, srcTexture.getTextureFormat(), destImage);
}